

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.h
# Opt level: O0

const_iterator __thiscall
frozen::set<unsigned_long,_3UL,_std::less<unsigned_long>_>::find<int>
          (set<unsigned_long,_3UL,_std::less<unsigned_long>_> *this,int *key)

{
  bool bVar1;
  set<unsigned_long,_3UL,_std::less<unsigned_long>_> *psVar2;
  set<unsigned_long,_3UL,_std::less<unsigned_long>_> *psVar3;
  key_compare *this_00;
  byte local_31;
  unsigned_long local_30;
  set<unsigned_long,_3UL,_std::less<unsigned_long>_> *local_28;
  const_iterator where;
  int *key_local;
  set<unsigned_long,_3UL,_std::less<unsigned_long>_> *this_local;
  
  where = (const_iterator)key;
  key_local = (int *)this;
  psVar2 = (set<unsigned_long,_3UL,_std::less<unsigned_long>_> *)lower_bound<int>(this,key);
  local_28 = psVar2;
  psVar3 = (set<unsigned_long,_3UL,_std::less<unsigned_long>_> *)end(this);
  local_31 = 0;
  if (psVar2 != psVar3) {
    this_00 = value_comp(this);
    local_30 = (unsigned_long)(int)*where;
    bVar1 = std::less<unsigned_long>::operator()(this_00,&local_30,(unsigned_long *)local_28);
    local_31 = bVar1 ^ 0xff;
  }
  if ((local_31 & 1) == 0) {
    this_local = (set<unsigned_long,_3UL,_std::less<unsigned_long>_> *)end(this);
  }
  else {
    this_local = local_28;
  }
  return (const_iterator)this_local;
}

Assistant:

constexpr const_iterator find(KeyType const &key) const {
    const_iterator where = lower_bound(key);
    if ((where != end()) && !value_comp()(key, *where))
      return where;
    else
      return end();
  }